

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_trace_v2(sqlite3 *db,uint mTrace,_func_int_uint_void_ptr_void_ptr_void_ptr *xTrace,
                    void *pArg)

{
  u8 uVar1;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (mTrace == 0) {
    xTrace = (_func_int_uint_void_ptr_void_ptr_void_ptr *)0x0;
  }
  uVar1 = (u8)mTrace;
  if (xTrace == (_func_int_uint_void_ptr_void_ptr_void_ptr *)0x0) {
    uVar1 = '\0';
  }
  db->mTrace = uVar1;
  db->xTrace = (_func_int_u32_void_ptr_void_ptr_void_ptr *)xTrace;
  db->pTraceArg = pArg;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_trace_v2(
  sqlite3 *db,                               /* Trace this connection */
  unsigned mTrace,                           /* Mask of events to be traced */
  int(*xTrace)(unsigned,void*,void*,void*),  /* Callback to invoke */
  void *pArg                                 /* Context */
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( mTrace==0 ) xTrace = 0;
  if( xTrace==0 ) mTrace = 0;
  db->mTrace = mTrace;
  db->xTrace = xTrace;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}